

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O1

void QSharedPointer<ocsp_cert_id_st>::deref(Data *dd)

{
  QBasicAtomicInt *pQVar1;
  
  if (dd != (Data *)0x0) {
    LOCK();
    pQVar1 = &dd->strongref;
    (pQVar1->_q_value).super___atomic_base<int>._M_i =
         (pQVar1->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->_q_value).super___atomic_base<int>._M_i == 0) {
      (*dd->destroyer)(dd);
    }
    LOCK();
    (dd->weakref)._q_value.super___atomic_base<int>._M_i =
         (dd->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((dd->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(dd);
      return;
    }
  }
  return;
}

Assistant:

static void deref(Data *dd) noexcept
    {
        if (!dd) return;
        if (!dd->strongref.deref()) {
            dd->destroy();
        }
        if (!dd->weakref.deref())
            delete dd;
    }